

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O0

vector<Json::Reader::StructuredError,_std::allocator<Json::Reader::StructuredError>_> * __thiscall
Json::Reader::getStructuredErrors
          (vector<Json::Reader::StructuredError,_std::allocator<Json::Reader::StructuredError>_>
           *__return_storage_ptr__,Reader *this)

{
  bool bVar1;
  undefined1 local_98 [8];
  StructuredError structured;
  ErrorInfo *error;
  undefined1 local_40 [8];
  const_iterator itError;
  Reader *this_local;
  vector<Json::Reader::StructuredError,_std::allocator<Json::Reader::StructuredError>_> *allErrors;
  
  itError._M_node._7_1_ = 0;
  std::vector<Json::Reader::StructuredError,_std::allocator<Json::Reader::StructuredError>_>::vector
            (__return_storage_ptr__);
  std::deque<Json::Reader::ErrorInfo,_std::allocator<Json::Reader::ErrorInfo>_>::begin
            ((const_iterator *)local_40,&this->errors_);
  while( true ) {
    std::deque<Json::Reader::ErrorInfo,_std::allocator<Json::Reader::ErrorInfo>_>::end
              ((const_iterator *)&error,&this->errors_);
    bVar1 = std::operator!=((_Self *)local_40,(_Self *)&error);
    if (!bVar1) break;
    structured.message.field_2._8_8_ =
         std::
         _Deque_iterator<Json::Reader::ErrorInfo,_const_Json::Reader::ErrorInfo_&,_const_Json::Reader::ErrorInfo_*>
         ::operator*((_Deque_iterator<Json::Reader::ErrorInfo,_const_Json::Reader::ErrorInfo_&,_const_Json::Reader::ErrorInfo_*>
                      *)local_40);
    StructuredError::StructuredError((StructuredError *)local_98);
    local_98 = (undefined1  [8])
               (*(long *)(structured.message.field_2._8_8_ + 8) - (long)this->begin_);
    structured.offset_start =
         *(long *)(structured.message.field_2._8_8_ + 0x10) - (long)this->begin_;
    std::__cxx11::string::operator=
              ((string *)&structured.offset_limit,
               (string *)(structured.message.field_2._8_8_ + 0x18));
    std::vector<Json::Reader::StructuredError,_std::allocator<Json::Reader::StructuredError>_>::
    push_back(__return_storage_ptr__,(value_type *)local_98);
    StructuredError::~StructuredError((StructuredError *)local_98);
    std::
    _Deque_iterator<Json::Reader::ErrorInfo,_const_Json::Reader::ErrorInfo_&,_const_Json::Reader::ErrorInfo_*>
    ::operator++((_Deque_iterator<Json::Reader::ErrorInfo,_const_Json::Reader::ErrorInfo_&,_const_Json::Reader::ErrorInfo_*>
                  *)local_40);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<Reader::StructuredError> Reader::getStructuredErrors() const {
  std::vector<Reader::StructuredError> allErrors;
  for (Errors::const_iterator itError = errors_.begin();
       itError != errors_.end();
       ++itError) {
    const ErrorInfo& error = *itError;
    Reader::StructuredError structured;
    structured.offset_start = error.token_.start_ - begin_;
    structured.offset_limit = error.token_.end_ - begin_;
    structured.message = error.message_;
    allErrors.push_back(structured);
  }
  return allErrors;
}